

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

CollationElementIterator * __thiscall
icu_63::RuleBasedCollator::createCollationElementIterator
          (RuleBasedCollator *this,UnicodeString *source)

{
  UBool UVar1;
  CollationElementIterator *this_00;
  UnicodeString *errorCode_00;
  UErrorCode errorCode;
  UErrorCode local_1c;
  
  errorCode_00 = (UnicodeString *)&stack0xffffffffffffffe4;
  local_1c = U_ZERO_ERROR;
  UVar1 = initMaxExpansions(this,(UErrorCode *)errorCode_00);
  if (UVar1 != '\0') {
    this_00 = (CollationElementIterator *)
              UMemory::operator_new((UMemory *)0x68,(size_t)errorCode_00);
    if (this_00 == (CollationElementIterator *)0x0) {
      this_00 = (CollationElementIterator *)0x0;
    }
    else {
      CollationElementIterator::CollationElementIterator
                (this_00,source,this,&stack0xffffffffffffffe4);
      errorCode_00 = source;
    }
    if (local_1c < U_ILLEGAL_ARGUMENT_ERROR) {
      return this_00;
    }
    if (this_00 != (CollationElementIterator *)0x0) {
      CollationElementIterator::~CollationElementIterator(this_00);
      UMemory::operator_delete((UMemory *)this_00,errorCode_00);
    }
  }
  return (CollationElementIterator *)0x0;
}

Assistant:

CollationElementIterator *
RuleBasedCollator::createCollationElementIterator(const UnicodeString& source) const {
    UErrorCode errorCode = U_ZERO_ERROR;
    if(!initMaxExpansions(errorCode)) { return NULL; }
    CollationElementIterator *cei = new CollationElementIterator(source, this, errorCode);
    if(U_FAILURE(errorCode)) {
        delete cei;
        return NULL;
    }
    return cei;
}